

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_compress.hpp
# Opt level: O0

void duckdb::PatasFinalizeCompress<float>(CompressionState *state_p)

{
  InternalException *this;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,"Patas has been deprecated, can no longer be used to compress data",&local_29)
  ;
  InternalException::InternalException(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void PatasFinalizeCompress(CompressionState &state_p) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
}